

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

Integer ma_table_lookup_assoc(TableData data)

{
  TableEntryState *pTVar1;
  long lVar2;
  
  if (0 < ma_table_capacity) {
    pTVar1 = &ma_table->state;
    lVar2 = 0;
    do {
      if ((*pTVar1 == TES_Allocated) && (((TableEntry *)(pTVar1 + -2))->data == data)) {
        return lVar2;
      }
      lVar2 = lVar2 + 1;
      pTVar1 = pTVar1 + 4;
    } while (ma_table_capacity != lVar2);
  }
  return -1;
}

Assistant:

public Integer ma_table_lookup_assoc(data)
    TableData    data;        /* to lookup */
{
    Integer    i;

    /* perform a linear search from the first table slot */
    for (i = 0; i < ma_table_capacity; i++)
        if ((ma_table[i].state == TES_Allocated) && (ma_table[i].data == data))
            /* success */
            return i;

    /* failure */
    return TABLE_HANDLE_NONE;
}